

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

void __thiscall CRegexParser::ensure_range_buf_space(CRegexParser *this)

{
  void *pvVar1;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x18) == 0) {
    *(undefined8 *)(in_RDI + 0x28) = 0x80;
    pvVar1 = malloc(*(long *)(in_RDI + 0x28) << 2);
    *(void **)(in_RDI + 0x18) = pvVar1;
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  else if (*(long *)(in_RDI + 0x20) == *(long *)(in_RDI + 0x28)) {
    *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 0x80;
    pvVar1 = realloc(*(void **)(in_RDI + 0x18),*(long *)(in_RDI + 0x28) << 2);
    *(void **)(in_RDI + 0x18) = pvVar1;
  }
  if (*(long *)(in_RDI + 0x18) != 0) {
    return;
  }
  err_throw(0);
}

Assistant:

void CRegexParser::ensure_range_buf_space()
{
    /* make sure we have room for another entry */
    if (range_buf_ == 0)
    {
        /* 
         *   allocate an initial size - it must be even, since we always
         *   consume elements in pairs 
         */
        range_buf_max_ = 128;
        range_buf_ = (wchar_t *)t3malloc(range_buf_max_ * sizeof(wchar_t));

        /* no entries yet */
        range_buf_cnt_ = 0;
    }
    else if (range_buf_cnt_ == range_buf_max_)
    {
        /* 
         *   reallocate the buffer at a larger size (the size must always be
         *   even, since we always add to the buffer in pairs) 
         */
        range_buf_max_ += 128;
        range_buf_ = (wchar_t *)t3realloc(range_buf_,
                                          range_buf_max_ * sizeof(wchar_t));
    }

    /* if the range buffer is null, throw an error */
    if (range_buf_ == 0)
        err_throw(VMERR_OUT_OF_MEMORY);
}